

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEVPMacAlgorithm.cpp
# Opt level: O0

bool __thiscall OSSLEVPMacAlgorithm::signFinal(OSSLEVPMacAlgorithm *this,ByteString *signature)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  uchar *md;
  ByteString *in_RSI;
  MacAlgorithm *in_RDI;
  uint outLen;
  ByteString *in_stack_ffffffffffffffd0;
  HMAC_CTX *ctx;
  uint local_1c;
  ByteString *local_18;
  bool local_1;
  
  local_18 = in_RSI;
  bVar1 = MacAlgorithm::signFinal(in_RDI,in_RSI);
  if (bVar1) {
    iVar2 = (*in_RDI->_vptr_MacAlgorithm[0xc])();
    EVP_MD_get_size(iVar2);
    ByteString::resize(in_stack_ffffffffffffffd0,(size_t)local_18);
    sVar3 = ByteString::size((ByteString *)0x1ba182);
    local_1c = (uint)sVar3;
    ctx = (HMAC_CTX *)in_RDI[1]._vptr_MacAlgorithm;
    md = ByteString::operator[]((ByteString *)ctx,(size_t)local_18);
    iVar2 = HMAC_Final(ctx,md,&local_1c);
    if (iVar2 == 0) {
      softHSMLog(3,"signFinal",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPMacAlgorithm.cpp"
                 ,0x76,"HMAC_Final failed");
      HMAC_CTX_free(in_RDI[1]._vptr_MacAlgorithm);
      in_RDI[1]._vptr_MacAlgorithm = (_func_int **)0x0;
      local_1 = false;
    }
    else {
      ByteString::resize((ByteString *)ctx,(size_t)local_18);
      HMAC_CTX_free(in_RDI[1]._vptr_MacAlgorithm);
      in_RDI[1]._vptr_MacAlgorithm = (_func_int **)0x0;
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool OSSLEVPMacAlgorithm::signFinal(ByteString& signature)
{
	if (!MacAlgorithm::signFinal(signature))
	{
		return false;
	}

	signature.resize(EVP_MD_size(getEVPHash()));
	unsigned int outLen = signature.size();

	if (!HMAC_Final(curCTX, &signature[0], &outLen))
	{
		ERROR_MSG("HMAC_Final failed");

		HMAC_CTX_free(curCTX);
		curCTX = NULL;

		return false;
	}

	signature.resize(outLen);

	HMAC_CTX_free(curCTX);
	curCTX = NULL;

	return true;
}